

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::getSource
          (Replacer *this,MemoryCopy *curr,Index sizeIdx,Index sourceIdx)

{
  Builder *this_00;
  Block *pBVar1;
  LocalGet *rightOperand;
  Expression *pEVar2;
  initializer_list<wasm::Expression_*> __l;
  Expression *local_68;
  LocalGet *local_60;
  undefined1 local_58 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> exprs;
  allocator_type local_31;
  
  pBVar1 = (Block *)addOffsetGlobal(this,curr->source,(Name)(curr->sourceMemory).super_IString.str);
  if (this->parent->checkBounds == true) {
    this_00 = &this->builder;
    exprs.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Builder::makeLocalGet(this_00,sourceIdx,(Type)(this->parent->pointerType).id);
    rightOperand = Builder::makeLocalGet(this_00,sizeIdx,(Type)(this->parent->pointerType).id);
    pEVar2 = makeAddGtuMemoryTrap
                       (this,(Expression *)
                             exprs.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (Expression *)rightOperand,(Name)(curr->sourceMemory).super_IString.str);
    local_60 = Builder::makeLocalGet(this_00,sourceIdx,(Type)(this->parent->pointerType).id);
    __l._M_len = 2;
    __l._M_array = &local_68;
    local_68 = pEVar2;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_58,__l,
               &local_31);
    pBVar1 = Builder::
             makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                       (this_00,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                                local_58);
    std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
              ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_58);
  }
  return (Expression *)pBVar1;
}

Assistant:

Expression* getSource(MemoryCopy* curr,
                          Index sizeIdx = Index(-1),
                          Index sourceIdx = Index(-1)) {
      Expression* sourceValue =
        addOffsetGlobal(curr->source, curr->sourceMemory);

      if (parent.checkBounds) {
        Expression* boundsCheck = makeAddGtuMemoryTrap(
          builder.makeLocalGet(sourceIdx, parent.pointerType),
          builder.makeLocalGet(sizeIdx, parent.pointerType),
          curr->sourceMemory);
        Expression* sourceGet =
          builder.makeLocalGet(sourceIdx, parent.pointerType);
        std::vector<Expression*> exprs = {boundsCheck, sourceGet};
        return builder.makeBlock(exprs);
      }

      return sourceValue;
    }